

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_goiftrue(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  iVar2 = -1;
  if ((1 < eVar1 - VK) && (eVar1 != VTRUE)) {
    if (eVar1 == VJMP) {
      puVar3 = fs->f->code + (e->u).info;
      if (((long)(e->u).info < 1) || (uVar4 = puVar3[-1], -1 < (char)luaP_opmodes[uVar4 & 0x3f])) {
        uVar4 = *puVar3;
      }
      else {
        puVar3 = puVar3 + -1;
      }
      *puVar3 = (uint)((uVar4 & 0x3fc0) == 0) << 6 | uVar4 & 0xffffc03f;
      iVar2 = (e->u).info;
    }
    else {
      iVar2 = jumponcond(fs,e,0);
    }
  }
  luaK_concat(fs,&e->f,iVar2);
  iVar2 = e->t;
  fs->lasttarget = fs->pc;
  luaK_concat(fs,&fs->jpc,iVar2);
  e->t = -1;
  return;
}

Assistant:

void luaK_goiftrue (FuncState *fs, expdesc *e) {
  int pc;  /* pc of last jump */
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VJMP: {
      invertjump(fs, e);
      pc = e->u.info;
      break;
    }
    case VK: case VKNUM: case VTRUE: {
      pc = NO_JUMP;  /* always true; do nothing */
      break;
    }
    default: {
      pc = jumponcond(fs, e, 0);
      break;
    }
  }
  luaK_concat(fs, &e->f, pc);  /* insert last jump in `f' list */
  luaK_patchtohere(fs, e->t);
  e->t = NO_JUMP;
}